

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# superscalar.cpp
# Opt level: O2

void __thiscall
defyx::SuperscalarInstructionInfo::SuperscalarInstructionInfo<2ul>
          (SuperscalarInstructionInfo *this,char *name,SuperscalarInstructionType type,
          MacroOp (*arr) [2],int resultOp,int dstOp,int srcOp)

{
  undefined8 *puVar1;
  undefined8 uVar2;
  long lVar3;
  MacroOp MStack_48;
  
  this->name_ = name;
  this->type_ = type;
  (this->ops_).super__Vector_base<defyx::MacroOp,_std::allocator<defyx::MacroOp>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->ops_).super__Vector_base<defyx::MacroOp,_std::allocator<defyx::MacroOp>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  *(undefined8 *)
   ((long)&(this->ops_).super__Vector_base<defyx::MacroOp,_std::allocator<defyx::MacroOp>_>._M_impl.
           super__Vector_impl_data._M_finish + 4) = 0;
  *(undefined8 *)
   ((long)&(this->ops_).super__Vector_base<defyx::MacroOp,_std::allocator<defyx::MacroOp>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage + 4) = 0;
  this->resultOp_ = resultOp;
  this->dstOp_ = dstOp;
  this->srcOp_ = srcOp;
  for (lVar3 = 0; lVar3 != 0x40; lVar3 = lVar3 + 0x20) {
    puVar1 = (undefined8 *)((long)&(*arr)[0].name_ + lVar3);
    MStack_48.name_ = (char *)*puVar1;
    uVar2 = puVar1[1];
    puVar1 = (undefined8 *)((long)&(*arr)[0].size_ + lVar3 + 1);
    MStack_48._17_8_ = puVar1[1];
    MStack_48.uop1_._0_1_ = (undefined1)((ulong)*puVar1 >> 0x38);
    MStack_48.size_._0_1_ = (undefined1)uVar2;
    MStack_48._9_7_ = SUB87((ulong)uVar2 >> 8,0);
    std::vector<defyx::MacroOp,_std::allocator<defyx::MacroOp>_>::emplace_back<defyx::MacroOp>
              (&this->ops_,&MStack_48);
    this->latency_ =
         this->latency_ +
         (this->ops_).super__Vector_base<defyx::MacroOp,_std::allocator<defyx::MacroOp>_>._M_impl.
         super__Vector_impl_data._M_finish[-1].latency_;
  }
  return;
}

Assistant:

SuperscalarInstructionInfo(const char* name, SuperscalarInstructionType type, const MacroOp(&arr)[N], int resultOp, int dstOp, int srcOp)
			: name_(name), type_(type), latency_(0), resultOp_(resultOp), dstOp_(dstOp), srcOp_(srcOp) {
			for (unsigned i = 0; i < N; ++i) {
				ops_.push_back(MacroOp(arr[i]));
				latency_ += ops_.back().getLatency();
			}
			static_assert(N > 1, "Invalid array size");
		}